

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall Server::run(Server *this)

{
  runtime_error *this_00;
  int *piVar1;
  allocator local_59;
  string local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [36];
  int local_14;
  Server *pSStack_10;
  int selected;
  Server *this_local;
  
  pSStack_10 = this;
  while( true ) {
    prepare_sets(this);
    local_14 = select(this->maxfd + 1,(fd_set *)this,(fd_set *)&this->wrfds,(fd_set *)0x0,
                      (timeval *)0x0);
    if (local_14 < 0) break;
    if (0 < local_14) {
      process_pending_clients(this);
      process_waiting_for_handshake(this);
      process_waiting_for_resolve(this);
      process_connections(this);
    }
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"select: ",&local_59);
  piVar1 = __errno_location();
  strerror(*piVar1);
  std::operator+(local_38,(char *)local_58);
  std::runtime_error::runtime_error(this_00,(string *)local_38);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Server::run() {
    while (true) {
        prepare_sets();
        int selected = select(maxfd + 1, &rdfds, &wrfds, NULL, NULL);
        if (selected < 0) {
            throw std::runtime_error(std::string("select: ") + strerror(errno));
        } else if (selected > 0) {
            process_pending_clients();
            process_waiting_for_handshake();
            process_waiting_for_resolve();
            process_connections();
        }
    }
}